

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

Vector3f pbrt::SampleTrowbridgeReitzVisibleArea(Vector3f *w,Float alpha_x,Float alpha_y,Point2f *u)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar11 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar13 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar14 [64];
  undefined1 auVar12 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar18 [64];
  float __x;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  Vector3f VVar24;
  float local_98;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  
  auVar18._4_60_ = in_register_00001244;
  auVar18._0_4_ = alpha_y;
  auVar14._4_60_ = in_register_00001204;
  auVar14._0_4_ = alpha_x;
  uVar1 = (w->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar2 = (w->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar13 = vinsertps_avx(auVar14._0_16_,auVar18._0_16_,0x10);
  auVar19._0_4_ = (float)uVar1 * auVar13._0_4_;
  auVar19._4_4_ = (float)uVar2 * auVar13._4_4_;
  auVar19._8_4_ = auVar13._8_4_ * 0.0;
  auVar19._12_4_ = auVar13._12_4_ * 0.0;
  fVar21 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar11._0_4_ = auVar19._0_4_ * auVar19._0_4_;
  auVar11._4_4_ = auVar19._4_4_ * auVar19._4_4_;
  auVar11._8_4_ = auVar19._8_4_ * auVar19._8_4_;
  auVar11._12_4_ = auVar19._12_4_ * auVar19._12_4_;
  auVar11 = vmovshdup_avx(auVar11);
  auVar11 = vfmadd231ss_fma(auVar11,auVar19,auVar19);
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
  local_48._0_12_ = ZEXT412(0);
  local_48._12_4_ = 0;
  if (auVar11._0_4_ < 0.0) {
    fVar7 = sqrtf(auVar11._0_4_);
  }
  else {
    auVar11 = vsqrtss_avx(auVar11,auVar11);
    fVar7 = auVar11._0_4_;
  }
  auVar16._4_4_ = fVar7;
  auVar16._0_4_ = fVar7;
  auVar16._8_4_ = fVar7;
  auVar16._12_4_ = fVar7;
  auVar11 = vdivps_avx(auVar19,auVar16);
  fVar21 = fVar21 / fVar7;
  auVar16 = ZEXT416((uint)fVar21);
  auVar19 = vmovshdup_avx(auVar11);
  fVar22 = auVar19._0_4_;
  fVar7 = auVar11._0_4_;
  if (0.99999 <= fVar21) {
    local_58 = SUB6416(ZEXT464(0x3f800000),0);
  }
  else {
    auVar12._0_12_ = ZEXT812(0);
    auVar12._12_4_ = 0;
    auVar12 = vfmsub213ss_fma(auVar12,auVar16,auVar19);
    fVar10 = auVar12._0_4_ + (fVar22 - fVar22);
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * 0.0)),auVar16,SUB6416(ZEXT464(0x80000000),0));
    fVar3 = (fVar7 - fVar21 * 0.0) + auVar12._0_4_;
    auVar5._0_12_ = ZEXT812(0);
    auVar5._12_4_ = 0;
    auVar5 = vfmsub213ss_fma(auVar5,auVar19,ZEXT416((uint)(fVar7 * 0.0)));
    auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0x80000000),0),auVar11,ZEXT416((uint)(fVar7 * 0.0)));
    fVar8 = auVar5._0_4_ + auVar12._0_4_;
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar10),
                              ZEXT416((uint)fVar10));
    auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
    if (auVar12._0_4_ < 0.0) {
      fVar9 = sqrtf(auVar12._0_4_);
    }
    else {
      auVar12 = vsqrtss_avx(auVar12,auVar12);
      fVar9 = auVar12._0_4_;
    }
    local_58 = vinsertps_avx(ZEXT416((uint)(fVar10 / fVar9)),ZEXT416((uint)(fVar3 / fVar9)),0x10);
    local_48 = ZEXT416((uint)(fVar8 / fVar9));
  }
  fVar10 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    auVar12 = vsqrtss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
    fVar10 = auVar12._0_4_;
  }
  fVar3 = (u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  fVar8 = cosf(fVar3);
  fVar8 = fVar8 * fVar10;
  fVar9 = sinf(fVar3);
  fVar3 = (fVar21 + 1.0) * 0.5;
  auVar12 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar8),
                             ZEXT416((uint)fVar8));
  __x = auVar12._0_4_;
  if (__x < 0.0) {
    auVar15._0_4_ = sqrtf(__x);
    auVar15._4_60_ = extraout_var;
    auVar5 = auVar15._0_16_;
    auVar12 = ZEXT416((uint)__x);
  }
  else {
    auVar5 = vsqrtss_avx(auVar12,auVar12);
  }
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar9 * fVar10)),ZEXT416((uint)(1.0 - fVar3)),
                           auVar5);
  auVar12 = vfnmadd231ss_fma(auVar12,auVar5,auVar5);
  auVar12 = vmaxss_avx(auVar12,ZEXT816(0) << 0x20);
  if (auVar12._0_4_ < 0.0) {
    fVar10 = sqrtf(auVar12._0_4_);
  }
  else {
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar10 = auVar12._0_4_;
  }
  if (SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
      ::reg == '\0') {
    iVar4 = __cxa_guard_acquire(&SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                                 ::reg);
    if (iVar4 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                  ::reg,SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                        ::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                 (PixelAccumFunc)0x0);
      __cxa_guard_release(&SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                           ::reg);
    }
  }
  auVar12 = vmovshdup_avx(local_58);
  auVar6 = ZEXT416((uint)(fVar22 * local_58._0_4_));
  auVar12 = vfmsub132ss_fma(auVar12,auVar6,ZEXT416((uint)fVar7));
  auVar19 = vfnmadd213ss_fma(auVar19,local_58,auVar6);
  local_98 = auVar5._0_4_;
  fVar21 = fVar10 * fVar21 +
           fVar8 * (float)local_48._0_4_ + (auVar12._0_4_ + auVar19._0_4_) * local_98;
  *(long *)(in_FS_OFFSET + -0xa0) = *(long *)(in_FS_OFFSET + -0xa0) + 1;
  if ((fVar21 == 0.0) && (!NAN(fVar21))) {
    *(long *)(in_FS_OFFSET + -0xa8) = *(long *)(in_FS_OFFSET + -0xa8) + 1;
  }
  auVar5 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar11,auVar16);
  auVar12 = vshufps_avx(local_58,local_58,0xe1);
  auVar19 = vinsertps_avx(auVar12,local_48,0x10);
  auVar23._0_4_ = auVar5._0_4_ * auVar19._0_4_;
  auVar23._4_4_ = auVar5._4_4_ * auVar19._4_4_;
  auVar23._8_4_ = auVar5._8_4_ * auVar19._8_4_;
  auVar23._12_4_ = auVar5._12_4_ * auVar19._12_4_;
  auVar16 = vmaxss_avx(ZEXT416((uint)fVar21),ZEXT416(0x358637bd));
  auVar6 = vpermi2ps_avx512vl(_DAT_00462b00,auVar5,auVar11);
  auVar20._4_12_ = auVar12._4_12_;
  auVar20._0_4_ = local_48._0_4_;
  auVar12 = vfmsub213ps_fma(auVar20,auVar6,auVar23);
  auVar19 = vfnmadd213ps_fma(auVar5,auVar19,auVar23);
  auVar6._0_4_ = (fVar7 * fVar10 +
                 local_58._0_4_ * fVar8 + (auVar12._0_4_ + auVar19._0_4_) * local_98) *
                 auVar13._0_4_;
  auVar6._4_4_ = (auVar11._4_4_ * fVar10 +
                 local_58._4_4_ * fVar8 + (auVar12._4_4_ + auVar19._4_4_) * local_98) *
                 auVar13._4_4_;
  auVar6._8_4_ = (auVar11._8_4_ * fVar10 +
                 local_58._8_4_ * fVar8 + (auVar12._8_4_ + auVar19._8_4_) * local_98) *
                 auVar13._8_4_;
  auVar6._12_4_ =
       (auVar11._12_4_ * fVar10 +
       local_58._12_4_ * fVar8 + (auVar12._12_4_ + auVar19._12_4_) * local_98) * auVar13._12_4_;
  auVar13._0_4_ = auVar6._0_4_ * auVar6._0_4_;
  auVar13._4_4_ = auVar6._4_4_ * auVar6._4_4_;
  auVar13._8_4_ = auVar6._8_4_ * auVar6._8_4_;
  auVar13._12_4_ = auVar6._12_4_ * auVar6._12_4_;
  auVar13 = vmovshdup_avx(auVar13);
  auVar13 = vfmadd231ss_fma(auVar13,auVar6,auVar6);
  auVar13 = vfmadd231ss_fma(auVar13,auVar16,auVar16);
  if (auVar13._0_4_ < 0.0) {
    fVar21 = sqrtf(auVar13._0_4_);
    auVar16 = ZEXT416(auVar16._0_4_);
  }
  else {
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    fVar21 = auVar13._0_4_;
  }
  auVar17._4_4_ = fVar21;
  auVar17._0_4_ = fVar21;
  auVar17._8_4_ = fVar21;
  auVar17._12_4_ = fVar21;
  auVar13 = vdivps_avx(auVar6,auVar17);
  VVar24.super_Tuple3<pbrt::Vector3,_float>.z = auVar16._0_4_ / fVar21;
  VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar13._0_8_;
  return (Vector3f)VVar24.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU
inline Vector3f SampleTrowbridgeReitzVisibleArea(const Vector3f &w, Float alpha_x,
                                                 Float alpha_y, const Point2f &u) {
    // Section 3.2: transforming the view direction to the hemisphere
    // configuration
    Vector3f wh = Normalize(Vector3f(alpha_x * w.x, alpha_y * w.y, w.z));

    // Section 4.1: orthonormal basis. Can't use CoordinateSystem() since
    // T1 has to be in the tangent plane w.r.t. (0,0,1).
    Vector3f T1 =
        (wh.z < 0.99999f) ? Normalize(Cross(Vector3f(0, 0, 1), wh)) : Vector3f(1, 0, 0);
    Vector3f T2 = Cross(wh, T1);

    // Section 4.2: parameterization of the projected area
    Float r = std::sqrt(u[0]);
    Float phi = 2 * Pi * u[1];
    Float t1 = r * std::cos(phi), t2 = r * std::sin(phi);
    Float s = 0.5f * (1 + wh.z);
    t2 = (1 - s) * std::sqrt(1 - t1 * t1) + s * t2;

    // Section 4.3: reprojection onto hemisphere
    Vector3f nh =
        t1 * T1 + t2 * T2 + std::sqrt(std::max<Float>(0, 1 - t1 * t1 - t2 * t2)) * wh;

    // Section 3.4: transforming the normal back to the ellipsoid configuration
    CHECK_RARE(1e-6, nh.z == 0);
    return Normalize(
        Vector3f(alpha_x * nh.x, alpha_y * nh.y, std::max<Float>(1e-6f, nh.z)));
}